

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

bool __thiscall
ON_PolynomialSurface::Create(ON_PolynomialSurface *this,int dim,bool is_rat,int order0,int order1)

{
  ON_4dPoint *pOVar1;
  bool local_21;
  bool rc;
  int order1_local;
  int order0_local;
  bool is_rat_local;
  int dim_local;
  ON_PolynomialSurface *this_local;
  
  if (dim < 1) {
    this->m_dim = 0;
  }
  else {
    this->m_dim = dim;
  }
  local_21 = dim >= 1;
  this->m_is_rat = (uint)is_rat;
  if (order0 < 1) {
    this->m_order[0] = 0;
    local_21 = false;
  }
  else {
    this->m_order[0] = order0;
  }
  if (order1 < 1) {
    this->m_order[1] = 0;
    local_21 = false;
  }
  else {
    this->m_order[1] = order1;
  }
  ON_SimpleArray<ON_4dPoint>::SetCapacity
            (&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>,
             (long)(this->m_order[0] * this->m_order[1]));
  if ((0 < this->m_order[0]) && (0 < this->m_order[1])) {
    ON_SimpleArray<ON_4dPoint>::Zero(&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>);
    pOVar1 = ON_SimpleArray<ON_4dPoint>::operator[]
                       (&(this->m_cv).super_ON_SimpleArray<ON_4dPoint>,0);
    pOVar1->w = 1.0;
  }
  return local_21;
}

Assistant:

bool ON_PolynomialSurface::Create( int dim, bool is_rat, int order0, int order1 )
{
  bool rc = true;
  if ( dim > 0 ) m_dim = dim; else {m_dim = 0; rc = false;};
  m_is_rat = is_rat?1:0;
  if ( order0 > 0 ) m_order[0] = order0; else { m_order[0] = 0; rc = false;}
  if ( order1 > 0 ) m_order[1] = order1; else { m_order[1] = 0; rc = false;}
  m_cv.SetCapacity( m_order[0]*m_order[1] );
  if ( m_order[0] > 0 && m_order[1] > 0 ) {
    m_cv.Zero();
    m_cv[0].w = 1.0;
  }
  return rc;
}